

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O1

int __thiscall ncnn::BatchNorm::forward_inplace(BatchNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 2) {
    iVar4 = bottom_top_blob->h;
    if (0 < (long)iVar4) {
      uVar9 = bottom_top_blob->w;
      pvVar10 = bottom_top_blob->data;
      pvVar5 = (this->a_data).data;
      pvVar6 = (this->b_data).data;
      sVar7 = bottom_top_blob->elemsize;
      lVar11 = 0;
      do {
        if (0 < (int)uVar9) {
          fVar1 = *(float *)((long)pvVar5 + lVar11 * 4);
          fVar2 = *(float *)((long)pvVar6 + lVar11 * 4);
          uVar12 = 0;
          do {
            *(float *)((long)pvVar10 + uVar12 * 4) =
                 *(float *)((long)pvVar10 + uVar12 * 4) * fVar2 + fVar1;
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
        }
        lVar11 = lVar11 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)(int)uVar9 * sVar7);
      } while (lVar11 != iVar4);
    }
  }
  else if ((iVar3 == 1) && (iVar4 = bottom_top_blob->w, 0 < (long)iVar4)) {
    pvVar10 = bottom_top_blob->data;
    pvVar5 = (this->a_data).data;
    pvVar6 = (this->b_data).data;
    lVar11 = 0;
    do {
      *(float *)((long)pvVar10 + lVar11 * 4) =
           *(float *)((long)pvVar10 + lVar11 * 4) * *(float *)((long)pvVar6 + lVar11 * 4) +
           *(float *)((long)pvVar5 + lVar11 * 4);
      lVar11 = lVar11 + 1;
    } while (iVar4 != lVar11);
  }
  if ((iVar3 - 3U < 2) && (iVar3 = bottom_top_blob->c, 0 < (long)iVar3)) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pvVar10 = bottom_top_blob->data;
    sVar7 = bottom_top_blob->cstep;
    pvVar5 = (this->a_data).data;
    pvVar6 = (this->b_data).data;
    sVar8 = bottom_top_blob->elemsize;
    lVar11 = 0;
    do {
      if (0 < (int)uVar9) {
        fVar1 = *(float *)((long)pvVar5 + lVar11 * 4);
        fVar2 = *(float *)((long)pvVar6 + lVar11 * 4);
        uVar12 = 0;
        do {
          *(float *)((long)pvVar10 + uVar12 * 4) =
               *(float *)((long)pvVar10 + uVar12 * 4) * fVar2 + fVar1;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      lVar11 = lVar11 + 1;
      pvVar10 = (void *)((long)pvVar10 + sVar7 * sVar8);
    } while (lVar11 != iVar3);
  }
  return 0;
}

Assistant:

int BatchNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // a = bias - slope * mean / sqrt(var)
    // b = slope / sqrt(var)
    // value = b * value + a

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < w; i++)
        {
            ptr[i] = b_data[i] * ptr[i] + a_data[i];
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

            for (int j = 0; j < w; j++)
            {
                ptr[j] = b * ptr[j] + a;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int c = bottom_top_blob.c;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

            for (int i = 0; i < size; i++)
            {
                ptr[i] = b * ptr[i] + a;
            }
        }
    }

    return 0;
}